

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O1

void __thiscall chrono::ChBody::VariablesQbIncrementPosition(ChBody *this,double dt_step)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  int iVar11;
  undefined1 auVar15 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  ChVector<double> newspeed;
  ChQuaternion<double> mnewrot;
  ChVector<double> newwel;
  ChVector<double> local_a0;
  ChQuaternion<double> local_88;
  undefined8 local_68;
  double local_58;
  ChVector<double> local_50;
  ChVector<double> local_38;
  undefined1 extraout_var [56];
  
  iVar11 = (*(this->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])();
  if ((char)iVar11 == '\0') {
    return;
  }
  ChVariables::Get_qb((ChVectorRef *)&local_50,(ChVariables *)&this->variables);
  local_88.m_data[0] = local_50.m_data[0];
  local_88.m_data[1] = 1.48219693752374e-323;
  local_68 = 0;
  local_58 = local_50.m_data[1];
  local_88.m_data[3] = (double)&local_50;
  if (2 < (long)local_50.m_data[1]) {
    ChVector<double>::
    ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
              (&local_a0,
               (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                *)&local_88,(type *)0x0);
    ChVariables::Get_qb((ChVectorRef *)&local_38,(ChVariables *)&this->variables);
    local_88.m_data[0] = (double)((long)local_38.m_data[0] + 0x18);
    local_88.m_data[1] = 1.48219693752374e-323;
    local_68 = 3;
    local_58 = local_38.m_data[1];
    local_88.m_data[3] = (double)&local_38;
    if (5 < (long)local_38.m_data[1]) {
      ChVector<double>::
      ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                (&local_50,
                 (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                  *)&local_88,(type *)0x0);
      dVar1 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
              m_data[2];
      dVar2 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
              m_data[1];
      (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.m_data
      [0] = dt_step * local_a0.m_data[0] +
            (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
            m_data[0];
      (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.m_data
      [1] = dt_step * local_a0.m_data[1] + dVar2;
      (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.m_data
      [2] = dt_step * local_a0.m_data[2] + dVar1;
      dVar1 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.rot.
              m_data[0];
      dVar2 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.rot.
              m_data[1];
      dVar3 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.rot.
              m_data[2];
      dVar4 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.rot.
              m_data[3];
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_50.m_data[0];
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                     Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[0];
      auVar25._8_8_ = 0;
      auVar25._0_8_ =
           local_50.m_data[1] *
           (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      auVar5 = vfmadd231sd_fma(auVar25,auVar15,auVar5);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_50.m_data[2];
      auVar6._8_8_ = 0;
      auVar6._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                     Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[2];
      auVar5 = vfmadd231sd_fma(auVar5,auVar20,auVar6);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                     Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[3];
      auVar30._8_8_ = 0;
      auVar30._0_8_ =
           local_50.m_data[1] *
           (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      auVar6 = vfmadd231sd_fma(auVar30,auVar15,auVar7);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                     Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[5];
      auVar6 = vfmadd231sd_fma(auVar6,auVar20,auVar8);
      auVar16._8_8_ = 0;
      auVar16._0_8_ =
           (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      auVar18._8_8_ = 0;
      auVar18._0_8_ =
           local_50.m_data[1] *
           (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
      auVar7 = vfmadd231sd_fma(auVar18,auVar15,auVar16);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                     Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8];
      auVar7 = vfmadd231sd_fma(auVar7,auVar20,auVar9);
      dVar29 = auVar6._0_8_;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = dVar29 * dVar29;
      auVar6 = vfmadd231sd_fma(auVar21,auVar5,auVar5);
      auVar22 = vfmadd231sd_fma(auVar6,auVar7,auVar7);
      if (auVar22._0_8_ < 0.0) {
        dVar12 = sqrt(auVar22._0_8_);
        auVar22._8_8_ = 0;
      }
      else {
        auVar6 = vsqrtsd_avx(auVar22,auVar22);
        dVar12 = auVar6._0_8_;
      }
      if (auVar22._0_8_ < 0.0) {
        dVar13 = sqrt(auVar22._0_8_);
      }
      else {
        auVar6 = vsqrtsd_avx(auVar22,auVar22);
        dVar13 = auVar6._0_8_;
      }
      bVar10 = 2.2250738585072014e-308 <= dVar13;
      dVar13 = 1.0 / dVar13;
      dVar12 = dVar12 * dt_step * 0.5;
      dVar14 = sin(dVar12);
      auVar17._0_8_ = cos(dVar12);
      auVar17._8_56_ = extraout_var;
      dVar12 = dVar14 * (double)((ulong)bVar10 * (long)(dVar13 * auVar5._0_8_) +
                                (ulong)!bVar10 * 0x3ff0000000000000);
      dVar29 = dVar14 * (double)((ulong)bVar10 * (long)(dVar13 * dVar29));
      dVar14 = dVar14 * (double)((ulong)bVar10 * (long)(dVar13 * auVar7._0_8_));
      auVar35._8_8_ = 0;
      auVar35._0_8_ = dVar2;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = dVar1;
      auVar16 = auVar17._0_16_;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = dVar2 * dVar12;
      auVar5 = vfmsub231sd_fma(auVar31,auVar16,auVar36);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = dVar3;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = dVar29;
      auVar5 = vfnmadd231sd_fma(auVar5,auVar23,auVar34);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = dVar4;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = dVar14;
      auVar7 = vfnmadd231sd_fma(auVar5,auVar26,auVar37);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = dVar1 * dVar12;
      auVar5 = vfmadd231sd_fma(auVar32,auVar16,auVar35);
      auVar5 = vfnmadd231sd_fma(auVar5,auVar26,auVar34);
      auVar5 = vfmadd231sd_fma(auVar5,auVar23,auVar37);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = dVar1 * dVar29;
      auVar6 = vfmadd231sd_fma(auVar33,auVar16,auVar34);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dVar14;
      auVar6 = vfmadd231sd_fma(auVar6,auVar27,auVar35);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar12;
      auVar8 = vfnmadd231sd_fma(auVar6,auVar19,auVar37);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar1 * dVar14;
      auVar6 = vfmadd231sd_fma(auVar28,auVar16,auVar37);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar29;
      auVar6 = vfnmadd231sd_fma(auVar6,auVar24,auVar35);
      auVar6 = vfmadd231sd_fma(auVar6,auVar19,auVar34);
      local_88.m_data[0] = auVar7._0_8_;
      local_88.m_data[1] = auVar5._0_8_;
      local_88.m_data[2] = auVar8._0_8_;
      local_88.m_data[3] = auVar6._0_8_;
      ChFrame<double>::SetRot((ChFrame<double> *)&this->super_ChBodyFrame,&local_88);
      return;
    }
  }
  local_88.m_data[1] = 1.48219693752374e-323;
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChBody::VariablesQbIncrementPosition(double dt_step) {
    if (!this->IsActive())
        return;

    // Updates position with incremental action of speed contained in the
    // 'qb' vector:  pos' = pos + dt * speed   , like in an Eulero step.

    ChVector<> newspeed(variables.Get_qb().segment(0, 3));
    ChVector<> newwel(variables.Get_qb().segment(3, 3));

    // ADVANCE POSITION: pos' = pos + dt * vel
    this->SetPos(this->GetPos() + newspeed * dt_step);

    // ADVANCE ROTATION: rot' = [dt*wwel]%rot  (use quaternion for delta rotation)
    ChQuaternion<> mdeltarot;
    ChQuaternion<> moldrot = this->GetRot();
    ChVector<> newwel_abs = Amatrix * newwel;
    double mangle = newwel_abs.Length() * dt_step;
    newwel_abs.Normalize();
    mdeltarot.Q_from_AngAxis(mangle, newwel_abs);
    ChQuaternion<> mnewrot = mdeltarot % moldrot;
    this->SetRot(mnewrot);
}